

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O3

int isoent_gen_joliet_identifier(archive_write *a,isoent *isoent,idr *idr)

{
  void *pvVar1;
  isoent *piVar2;
  ulong uVar3;
  int iVar4;
  wchar_t wVar5;
  char *pcVar6;
  ulong uVar7;
  int *piVar8;
  isofile *piVar9;
  ulong uVar10;
  isoent *piVar11;
  int weight;
  uchar *p;
  int iVar12;
  char *pcVar13;
  uint uVar14;
  ulong __n;
  isoent *piVar15;
  ulong uVar16;
  archive_rb_tree_ops *in_stack_ffffffffffffff88;
  
  iVar12 = (isoent->children).cnt;
  iVar4 = 0;
  if (iVar12 != 0) {
    pvVar1 = a->format_data;
    uVar10 = 0x80;
    if ((*(uint *)((long)pvVar1 + 0x10370) & 0x60000) == 0x40000) {
      uVar10 = 0xce;
    }
    iVar4 = idr_start(a,idr,iVar12,6,2,0x1ad9d8,in_stack_ffffffffffffff88);
    if (-1 < iVar4) {
      uVar16 = 1;
      piVar2 = isoent->parent;
      piVar11 = isoent;
      if (isoent->parent != isoent) {
        do {
          piVar15 = piVar2;
          uVar16 = uVar16 + (long)piVar11->mb_len + 1;
          piVar2 = piVar15->parent;
          piVar11 = piVar15;
        } while (piVar15->parent != piVar15);
      }
      piVar2 = (isoent->children).first;
      if (piVar2 != (isoent *)0x0) {
        piVar11 = piVar2;
        do {
          piVar9 = piVar11->file;
          uVar3 = (piVar9->basename_utf16).length;
          __n = uVar10;
          if (uVar3 < uVar10) {
            __n = uVar3;
          }
          pcVar6 = (char *)malloc((__n & 0xffffffff) * 2 + 2);
          if (pcVar6 == (char *)0x0) {
            pcVar6 = "Can\'t allocate memory";
LAB_0016e520:
            archive_set_error(&a->archive,0xc,pcVar6);
            return -0x1e;
          }
          memcpy(pcVar6,(piVar9->basename_utf16).s,__n);
          pcVar13 = pcVar6 + __n;
          iVar12 = (int)pcVar13;
          (pcVar6 + __n)[0] = '\0';
          (pcVar6 + __n)[1] = '\0';
          piVar11->identifier = pcVar6;
          uVar7 = __n;
          if (uVar3 != 0) {
            do {
              uVar14 = (uint)CONCAT11(*pcVar6,pcVar6[1]);
              if ((uVar14 < 0x20) ||
                 ((uVar14 = uVar14 - 0x2a, uVar14 < 0x33 &&
                  ((0x4000000230021U >> ((ulong)uVar14 & 0x3f) & 1) != 0)))) {
                pcVar6[0] = '\0';
                pcVar6[1] = '_';
              }
              else if ((*pcVar6 == '\0') && (pcVar6[1] == '.')) {
                pcVar13 = pcVar6;
              }
              iVar12 = (int)pcVar13;
              pcVar6 = pcVar6 + 2;
              uVar7 = uVar7 - 2;
            } while (uVar7 != 0);
            pcVar6 = piVar11->identifier;
          }
          iVar12 = iVar12 - (int)pcVar6;
          piVar11->ext_off = iVar12;
          piVar11->ext_len = (int)__n - iVar12;
          piVar11->id_len = (int)__n;
          piVar9 = piVar11->file;
          if (uVar10 < (piVar9->basename_utf16).length) {
            wVar5 = archive_strncpy_l((archive_string *)((long)pvVar1 + 0x60),pcVar6,__n,
                                      *(archive_string_conv **)((long)pvVar1 + 0x80));
            if ((wVar5 != L'\0') && (piVar8 = __errno_location(), *piVar8 == 0xc)) {
              pcVar6 = "No memory";
              goto LAB_0016e520;
            }
            iVar4 = *(int *)((long)pvVar1 + 0x68);
            piVar11->mb_len = iVar4;
            piVar9 = piVar11->file;
            weight = iVar4;
            if (iVar4 == (int)(piVar9->basename).length) {
              weight = 0;
            }
          }
          else {
            iVar4 = (int)(piVar9->basename).length;
            piVar11->mb_len = iVar4;
            weight = 0;
          }
          piVar15 = piVar2;
          if (((0xf0 < uVar16) || (piVar15 = piVar11, 0xf0 < iVar4)) ||
             (0xf0 < (long)iVar4 + uVar16)) {
            pcVar6 = archive_entry_pathname(piVar9->entry);
            archive_set_error(&a->archive,-1,
                              "The regulation of Joliet extensions; A length of a full-pathname of `%s\' is longer than 240 bytes, (p=%d, b=%d)"
                              ,pcVar6,uVar16 & 0xffffffff,(ulong)(uint)piVar15->mb_len);
            return -0x1e;
          }
          if (uVar3 < uVar10) {
            if (__n == uVar10 - 2) {
              iVar4 = iVar12 + -4;
            }
            else {
              iVar4 = iVar12 + -2;
              if (__n != uVar10 - 4) {
                iVar4 = iVar12;
              }
            }
          }
          else {
            iVar4 = iVar12 + -6;
          }
          idr_register(idr,piVar11,weight,iVar4);
          piVar11 = piVar11->chnext;
        } while (piVar11 != (isoent *)0x0);
      }
      idr_resolve(idr,idr_set_num_beutf16);
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

static int
isoent_gen_joliet_identifier(struct archive_write *a, struct isoent *isoent,
    struct idr *idr)
{
	struct iso9660 *iso9660;
	struct isoent *np;
	unsigned char *p;
	size_t l;
	int r;
	size_t ffmax, parent_len;
	static const struct archive_rb_tree_ops rb_ops = {
		isoent_cmp_node_joliet, isoent_cmp_key_joliet
	};

	if (isoent->children.cnt == 0)
		return (0);

	iso9660 = a->format_data;
	if (iso9660->opt.joliet == OPT_JOLIET_LONGNAME)
		ffmax = 206;
	else
		ffmax = 128;

	r = idr_start(a, idr, isoent->children.cnt, (int)ffmax, 6, 2, &rb_ops);
	if (r < 0)
		return (r);

	parent_len = 1;
	for (np = isoent; np->parent != np; np = np->parent)
		parent_len += np->mb_len + 1;

	for (np = isoent->children.first; np != NULL; np = np->chnext) {
		unsigned char *dot;
		int ext_off, noff, weight;
		size_t lt;

		if ((l = np->file->basename_utf16.length) > ffmax)
			l = ffmax;

		p = malloc((l+1)*2);
		if (p == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory");
			return (ARCHIVE_FATAL);
		}
		memcpy(p, np->file->basename_utf16.s, l);
		p[l] = 0;
		p[l+1] = 0;

		np->identifier = (char *)p;
		lt = l;
		dot = p + l;
		weight = 0;
		while (lt > 0) {
			if (!joliet_allowed_char(p[0], p[1]))
				archive_be16enc(p, 0x005F); /* '_' */
			else if (p[0] == 0 && p[1] == 0x2E) /* '.' */
				dot = p;
			p += 2;
			lt -= 2;
		}
		ext_off = (int)(dot - (unsigned char *)np->identifier);
		np->ext_off = ext_off;
		np->ext_len = (int)l - ext_off;
		np->id_len = (int)l;

		/*
		 * Get a length of MBS of a full-pathname.
		 */
		if (np->file->basename_utf16.length > ffmax) {
			if (archive_strncpy_l(&iso9660->mbs,
			    (const char *)np->identifier, l,
				iso9660->sconv_from_utf16be) != 0 &&
			    errno == ENOMEM) {
				archive_set_error(&a->archive, errno,
				    "No memory");
				return (ARCHIVE_FATAL);
			}
			np->mb_len = (int)iso9660->mbs.length;
			if (np->mb_len != (int)np->file->basename.length)
				weight = np->mb_len;
		} else
			np->mb_len = (int)np->file->basename.length;

		/* If a length of full-pathname is longer than 240 bytes,
		 * it violates Joliet extensions regulation. */
		if (parent_len > 240
		    || np->mb_len > 240
		    || parent_len + np->mb_len > 240) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "The regulation of Joliet extensions;"
			    " A length of a full-pathname of `%s' is "
			    "longer than 240 bytes, (p=%d, b=%d)",
			    archive_entry_pathname(np->file->entry),
			    (int)parent_len, (int)np->mb_len);
			return (ARCHIVE_FATAL);
		}

		/* Make an offset of the number which is used to be set
		 * hexadecimal number to avoid duplicate identifier. */
		if (l == ffmax)
			noff = ext_off - 6;
		else if (l == ffmax-2)
			noff = ext_off - 4;
		else if (l == ffmax-4)
			noff = ext_off - 2;
		else
			noff = ext_off;
		/* Register entry to the identifier resolver. */
		idr_register(idr, np, weight, noff);
	}

	/* Resolve duplicate identifier with Joliet Volume. */
	idr_resolve(idr, idr_set_num_beutf16);

	return (ARCHIVE_OK);
}